

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

bool DerBase::DecodeSetOrSequenceOf<CertificateChoices>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<CertificateChoices,_std::allocator<CertificateChoices>_> *out)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  overflow_error *this;
  bool bVar5;
  value_type local_b0;
  uchar *local_70;
  ulong local_68;
  _func_int **local_60;
  vector<CertificateChoices,_std::allocator<CertificateChoices>_> *local_58;
  size_t local_50;
  size_t cbElement;
  size_t *local_40;
  bool local_31 [8];
  bool isNull;
  
  local_31[0] = false;
  local_58 = out;
  std::vector<CertificateChoices,_std::allocator<CertificateChoices>_>::clear(out);
  local_70 = pIn;
  cbElement = (size_t)cbSize;
  local_40 = cbPrefix;
  bVar2 = DecodeSequenceOrSet(type,pIn,cbIn,cbPrefix,cbSize,local_31);
  if (bVar2) {
    sVar4 = 2;
    if (local_31[0] == false) {
      sVar4 = *local_40;
      local_68 = *(long *)cbElement + sVar4;
      local_60 = (_func_int **)&PTR_EncodedSize_00151828;
      do {
        local_50 = 0;
        local_b0.super_DerBase.cbData = 0;
        local_b0.super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00151698;
        local_b0.value.super_DerBase.cbData = 0;
        local_b0.value.super_DerBase._vptr_DerBase = local_60;
        local_b0.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_b0._52_8_ = 0;
        local_b0.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        local_b0.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        if (local_68 < sVar4) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        bVar3 = AnyType::Decode(&local_b0.value,local_70 + sVar4,local_68 - sVar4,&local_50);
        sVar1 = local_50;
        if (bVar3) {
          std::vector<CertificateChoices,_std::allocator<CertificateChoices>_>::push_back
                    (local_58,&local_b0);
          sVar4 = sVar4 + sVar1;
          bVar5 = sVar4 == *local_40 + *(long *)cbElement;
          bVar3 = !bVar5;
          bVar2 = (bool)(bVar5 | bVar2);
        }
        else {
          bVar2 = false;
          if (local_50 == 0) {
            *local_40 = 0;
            *(undefined8 *)cbElement = 0;
          }
          bVar3 = false;
        }
        if (local_b0.value.encodedValue.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0.value.encodedValue.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      } while (bVar3);
      return bVar2;
    }
  }
  else {
    sVar4 = 0;
  }
  *local_40 = sVar4;
  *(undefined8 *)cbElement = 0;
  return bVar2;
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}